

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O2

void __thiscall HFactor::reportLu(HFactor *this,HighsInt l_u_or_both,bool full)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  undefined7 in_register_00000011;
  HighsInt iEl_1;
  long lVar4;
  ulong uVar5;
  HFactor *pHVar6;
  HighsInt iEl;
  long lVar7;
  allocator local_555;
  undefined4 local_554;
  ulong local_550;
  ulong local_548;
  vector<int,_std::allocator<int>_> *local_540;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_258 [48];
  undefined1 local_228 [48];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [48];
  undefined1 local_198 [48];
  undefined1 local_168 [48];
  undefined1 local_138 [48];
  undefined1 local_108 [48];
  undefined1 local_d8 [48];
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  
  if (0xfffffffc < l_u_or_both - 4U) {
    if ((l_u_or_both & 1U) != 0) {
      putchar(0x4c);
      if (full) {
        printf(" - full");
        puts(":");
        std::__cxx11::string::string((string *)&local_278,"l_pivot_lookup",&local_555);
        pHVar6 = (HFactor *)&stack0xffffffffffffffb8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->l_pivot_lookup);
        reportIntVector(pHVar6,&local_278,
                        (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::string((string *)&local_298,"l_pivot_index",&local_555);
        pHVar6 = (HFactor *)(local_78 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->l_pivot_index);
        reportIntVector(pHVar6,&local_298,(vector<int,_std::allocator<int>_> *)(local_78 + 0x18));
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)(local_78 + 0x18));
        std::__cxx11::string::~string((string *)&local_298);
      }
      else {
        puts(":");
      }
      std::__cxx11::string::string((string *)&local_2b8,"l_start",&local_555);
      pHVar6 = (HFactor *)local_78;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar6,&this->l_start);
      reportIntVector(pHVar6,&local_2b8,(vector<int,_std::allocator<int>_> *)local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_78);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string((string *)&local_2d8,"l_index",&local_555);
      pHVar6 = (HFactor *)(local_a8 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar6,&this->l_index);
      reportIntVector(pHVar6,&local_2d8,(vector<int,_std::allocator<int>_> *)(local_a8 + 0x18));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)(local_a8 + 0x18));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::string((string *)&local_2f8,"l_value",&local_555);
      pHVar6 = (HFactor *)local_a8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar6,&this->l_value);
      reportDoubleVector(pHVar6,&local_2f8,(vector<double,_std::allocator<double>_> *)local_a8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_a8);
      std::__cxx11::string::~string((string *)&local_2f8);
      if (full) {
        std::__cxx11::string::string((string *)&local_318,"lr_start",&local_555);
        pHVar6 = (HFactor *)(local_d8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->lr_start);
        reportIntVector(pHVar6,&local_318,(vector<int,_std::allocator<int>_> *)(local_d8 + 0x18));
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)(local_d8 + 0x18));
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::string((string *)&local_338,"lr_index",&local_555);
        pHVar6 = (HFactor *)local_d8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->lr_index);
        reportIntVector(pHVar6,&local_338,(vector<int,_std::allocator<int>_> *)local_d8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_d8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::string((string *)&local_358,"lr_value",&local_555);
        pHVar6 = (HFactor *)(local_108 + 0x18);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)pHVar6,&this->lr_value);
        reportDoubleVector(pHVar6,&local_358,
                           (vector<double,_std::allocator<double>_> *)(local_108 + 0x18));
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)(local_108 + 0x18));
        std::__cxx11::string::~string((string *)&local_358);
      }
    }
    if (1 < (uint)l_u_or_both) {
      putchar(0x55);
      if (full) {
        printf(" - full");
        puts(":");
        std::__cxx11::string::string((string *)&local_378,"u_pivot_lookup",&local_555);
        pHVar6 = (HFactor *)local_108;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->u_pivot_lookup);
        reportIntVector(pHVar6,&local_378,(vector<int,_std::allocator<int>_> *)local_108);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_108);
        std::__cxx11::string::~string((string *)&local_378);
      }
      else {
        puts(":");
      }
      std::__cxx11::string::string((string *)&local_398,"u_pivot_index",&local_555);
      pHVar6 = (HFactor *)(local_138 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar6,&this->u_pivot_index);
      reportIntVector(pHVar6,&local_398,(vector<int,_std::allocator<int>_> *)(local_138 + 0x18));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)(local_138 + 0x18));
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::string((string *)&local_3b8,"u_pivot_value",&local_555);
      pHVar6 = (HFactor *)local_138;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar6,&this->u_pivot_value);
      reportDoubleVector(pHVar6,&local_3b8,(vector<double,_std::allocator<double>_> *)local_138);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_138);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::string((string *)&local_3d8,"u_start",&local_555);
      pHVar6 = (HFactor *)(local_168 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar6,&this->u_start);
      reportIntVector(pHVar6,&local_3d8,(vector<int,_std::allocator<int>_> *)(local_168 + 0x18));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)(local_168 + 0x18));
      std::__cxx11::string::~string((string *)&local_3d8);
      if (full) {
        std::__cxx11::string::string((string *)&local_3f8,"u_last_p",&local_555);
        pHVar6 = (HFactor *)local_168;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->u_last_p);
        reportIntVector(pHVar6,&local_3f8,(vector<int,_std::allocator<int>_> *)local_168);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_168);
        std::__cxx11::string::~string((string *)&local_3f8);
      }
      std::__cxx11::string::string((string *)&local_418,"u_index",&local_555);
      pHVar6 = (HFactor *)(local_198 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar6,&this->u_index);
      reportIntVector(pHVar6,&local_418,(vector<int,_std::allocator<int>_> *)(local_198 + 0x18));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 0x18));
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::string((string *)&local_438,"u_value",&local_555);
      pHVar6 = (HFactor *)local_198;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar6,&this->u_value);
      reportDoubleVector(pHVar6,&local_438,(vector<double,_std::allocator<double>_> *)local_198);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_198);
      std::__cxx11::string::~string((string *)&local_438);
      if (full) {
        std::__cxx11::string::string((string *)&local_458,"ur_start",&local_555);
        pHVar6 = (HFactor *)(local_1c8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->ur_start);
        reportIntVector(pHVar6,&local_458,(vector<int,_std::allocator<int>_> *)(local_1c8 + 0x18));
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)(local_1c8 + 0x18));
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::string((string *)&local_478,"ur_lastp",&local_555);
        local_540 = &this->ur_lastp;
        pHVar6 = (HFactor *)local_1c8;
        local_550 = (ulong)(uint)l_u_or_both;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,local_540);
        reportIntVector(pHVar6,&local_478,(vector<int,_std::allocator<int>_> *)local_1c8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_1c8);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::string((string *)&local_498,"ur_space",&local_555);
        local_554 = (undefined4)CONCAT71(in_register_00000011,full);
        pHVar6 = (HFactor *)(local_1f8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar6,&this->ur_space);
        reportIntVector(pHVar6,&local_498,(vector<int,_std::allocator<int>_> *)(local_1f8 + 0x18));
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)(local_1f8 + 0x18));
        std::__cxx11::string::~string((string *)&local_498);
        uVar5 = 0;
        while( true ) {
          piVar3 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar5) break;
          iVar1 = piVar3[uVar5];
          lVar4 = (long)iVar1;
          iVar2 = (local_540->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
          if (iVar1 < iVar2) {
            local_548 = uVar5;
            printf("UR    Row %2d: ");
            for (lVar7 = lVar4; lVar7 < iVar2; lVar7 = lVar7 + 1) {
              printf("%11d ",(ulong)(uint)(this->ur_index).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[lVar7]);
            }
            printf("\n              ");
            for (; lVar4 < iVar2; lVar4 = lVar4 + 1) {
              printf("%11.4g ",
                     (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4]);
            }
            putchar(10);
            uVar5 = local_548;
          }
          uVar5 = uVar5 + 1;
        }
        if ((char)local_554 == '\x01' && (int)local_550 == 3) {
          std::__cxx11::string::string((string *)&local_4b8,"pf_pivot_value",&local_555);
          pHVar6 = (HFactor *)local_1f8;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)pHVar6,&this->pf_pivot_value);
          reportDoubleVector(pHVar6,&local_4b8,(vector<double,_std::allocator<double>_> *)local_1f8)
          ;
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)local_1f8);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::string((string *)&local_4d8,"pf_pivot_index",&local_555);
          pHVar6 = (HFactor *)(local_228 + 0x18);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)pHVar6,&this->pf_pivot_index);
          reportIntVector(pHVar6,&local_4d8,(vector<int,_std::allocator<int>_> *)(local_228 + 0x18))
          ;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)(local_228 + 0x18));
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::string((string *)&local_4f8,"pf_start",&local_555);
          pHVar6 = (HFactor *)local_228;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)pHVar6,&this->pf_start);
          reportIntVector(pHVar6,&local_4f8,(vector<int,_std::allocator<int>_> *)local_228);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)local_228);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::string((string *)&local_518,"pf_index",&local_555);
          pHVar6 = (HFactor *)(local_258 + 0x18);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)pHVar6,&this->pf_index);
          reportIntVector(pHVar6,&local_518,(vector<int,_std::allocator<int>_> *)(local_258 + 0x18))
          ;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)(local_258 + 0x18));
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::string((string *)&local_538,"pf_value",&local_555);
          pHVar6 = (HFactor *)local_258;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)pHVar6,&this->pf_value);
          reportDoubleVector(pHVar6,&local_538,(vector<double,_std::allocator<double>_> *)local_258)
          ;
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)local_258);
          std::__cxx11::string::~string((string *)&local_538);
        }
      }
    }
  }
  return;
}

Assistant:

void HFactor::reportLu(const HighsInt l_u_or_both, const bool full) const {
  if (l_u_or_both < kReportLuJustL || l_u_or_both > kReportLuBoth) return;
  if (l_u_or_both & 1) {
    printf("L");
    if (full) printf(" - full");
    printf(":\n");

    if (full) reportIntVector("l_pivot_lookup", l_pivot_lookup);
    if (full) reportIntVector("l_pivot_index", l_pivot_index);
    reportIntVector("l_start", l_start);
    reportIntVector("l_index", l_index);
    reportDoubleVector("l_value", l_value);
    if (full) {
      reportIntVector("lr_start", lr_start);
      reportIntVector("lr_index", lr_index);
      reportDoubleVector("lr_value", lr_value);
    }
  }
  if (l_u_or_both & 2) {
    printf("U");
    if (full) printf(" - full");
    printf(":\n");
    if (full) reportIntVector("u_pivot_lookup", u_pivot_lookup);
    reportIntVector("u_pivot_index", u_pivot_index);
    reportDoubleVector("u_pivot_value", u_pivot_value);
    reportIntVector("u_start", u_start);
    if (full) reportIntVector("u_last_p", u_last_p);
    reportIntVector("u_index", u_index);
    reportDoubleVector("u_value", u_value);
    if (full) {
      reportIntVector("ur_start", ur_start);
      reportIntVector("ur_lastp", ur_lastp);
      reportIntVector("ur_space", ur_space);
      for (size_t iRow = 0; iRow < ur_start.size(); iRow++) {
        const HighsInt start = ur_start[iRow];
        const HighsInt end = ur_lastp[iRow];
        if (start >= end) continue;
        printf("UR    Row %2d: ", (int)iRow);
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11d ", (int)ur_index[iEl]);
        printf("\n              ");
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11.4g ", ur_value[iEl]);
        printf("\n");
      }
      //      reportIntVector("ur_index", ur_index);
      //      reportDoubleVector("ur_value", ur_value);
    }
  }
  if (l_u_or_both == 3 && full) {
    reportDoubleVector("pf_pivot_value", pf_pivot_value);
    reportIntVector("pf_pivot_index", pf_pivot_index);
    reportIntVector("pf_start", pf_start);
    reportIntVector("pf_index", pf_index);
    reportDoubleVector("pf_value", pf_value);
  }
}